

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::DOMDocumentImpl::cloneString(DOMDocumentImpl *this,XMLCh *src)

{
  int iVar1;
  XMLSize_t XVar2;
  ulong uVar3;
  undefined4 extraout_var;
  XMLCh *newStr;
  XMLSize_t len;
  XMLCh *src_local;
  DOMDocumentImpl *this_local;
  
  if (src == (XMLCh *)0x0) {
    this_local = (DOMDocumentImpl *)0x0;
  }
  else {
    XVar2 = XMLString::stringLen(src);
    uVar3 = (XVar2 + 1) * 2;
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,(uVar3 & 3) + uVar3);
    this_local = (DOMDocumentImpl *)CONCAT44(extraout_var,iVar1);
    XMLString::copyString((XMLCh *)this_local,src);
  }
  return (XMLCh *)this_local;
}

Assistant:

XMLCh * DOMDocumentImpl::cloneString(const XMLCh *src)
{
    if (!src) return 0;
    XMLSize_t len = XMLString::stringLen(src);
    len = (len + 1) * sizeof(XMLCh);
    len = (len % 4) + len;
    XMLCh *newStr = (XMLCh *)this->allocate(len);
    XMLString::copyString(newStr, src);
    return newStr;
}